

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O3

int Dar2_LibEval(Gia_Man_t *p,Vec_Int_t *vCutLits,uint uTruth,int fKeepLevel,Vec_Int_t *vLeavesBest2
                )

{
  size_t __size;
  byte bVar1;
  int iVar2;
  int iVar3;
  Dar_LibObj_t *pObj;
  int *piVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  Dar_Lib_t *pDVar10;
  int local_5c;
  
  if (vCutLits->nSize != 4) {
    __assert_fail("Vec_IntSize(vCutLits) == 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darLib.c"
                  ,0x4ab,
                  "int Dar2_LibEval(Gia_Man_t *, Vec_Int_t *, unsigned int, int, Vec_Int_t *)");
  }
  if (0xffff < uTruth) {
    __assert_fail("(uTruth >> 16) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darLib.c"
                  ,0x4ac,
                  "int Dar2_LibEval(Gia_Man_t *, Vec_Int_t *, unsigned int, int, Vec_Int_t *)");
  }
  Dar2_LibCutMatch(p,vCutLits,uTruth);
  bVar1 = s_DarLib->pMap[uTruth];
  Dar2_LibEvalAssignNums(p,(uint)bVar1);
  if (0 < s_DarLib->nSubgr0[bVar1]) {
    iVar8 = -1000000;
    iVar5 = 1000000;
    local_5c = -1;
    lVar7 = 0;
    pDVar10 = s_DarLib;
    do {
      pObj = pDVar10->pObjs + pDVar10->pSubgr0[bVar1][lVar7];
      iVar2 = Dar2_LibEval_rec(pObj,(int)lVar7);
      pDVar10 = s_DarLib;
      iVar3 = -iVar2;
      if (fKeepLevel == 0) {
        if ((iVar8 == iVar3 || SBORROW4(iVar8,iVar3) != iVar8 + iVar2 < 0) &&
           ((iVar8 != iVar3 || (s_DarLib->pDatas[(ulong)*pObj >> 0x24].Level < iVar5))))
        goto LAB_004f72e6;
      }
      else {
        iVar2 = s_DarLib->pDatas[(ulong)*pObj >> 0x24].Level;
        if ((iVar2 <= iVar5) && ((iVar2 != iVar5 || (iVar8 < iVar3)))) {
LAB_004f72e6:
          vLeavesBest2->nSize = 0;
          if (0 < vCutLits->nSize) {
            lVar6 = 0;
            lVar9 = 1;
            iVar5 = 0;
            do {
              iVar8 = *(int *)(pDVar10->pDatas->nLats + lVar6 + -0x15);
              if (iVar5 == vLeavesBest2->nCap) {
                if (iVar5 < 0x10) {
                  if (vLeavesBest2->pArray == (int *)0x0) {
                    piVar4 = (int *)malloc(0x40);
                  }
                  else {
                    piVar4 = (int *)realloc(vLeavesBest2->pArray,0x40);
                  }
                  vLeavesBest2->pArray = piVar4;
                  if (piVar4 == (int *)0x0) {
LAB_004f742f:
                    __assert_fail("p->pArray",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                  ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
                  }
                  vLeavesBest2->nCap = 0x10;
                }
                else {
                  __size = (ulong)(uint)(iVar5 * 2) * 4;
                  if (vLeavesBest2->pArray == (int *)0x0) {
                    piVar4 = (int *)malloc(__size);
                  }
                  else {
                    piVar4 = (int *)realloc(vLeavesBest2->pArray,__size);
                  }
                  vLeavesBest2->pArray = piVar4;
                  if (piVar4 == (int *)0x0) goto LAB_004f742f;
                  vLeavesBest2->nCap = iVar5 * 2;
                }
              }
              else {
                piVar4 = vLeavesBest2->pArray;
              }
              iVar5 = vLeavesBest2->nSize;
              vLeavesBest2->nSize = iVar5 + 1;
              piVar4[iVar5] = iVar8;
              if (vCutLits->nSize <= lVar9) break;
              iVar5 = vLeavesBest2->nSize;
              lVar6 = lVar6 + 0x18;
              lVar9 = lVar9 + 1;
            } while( true );
          }
          local_5c = pDVar10->pSubgr0[bVar1][lVar7];
          iVar5 = pDVar10->pDatas[(ulong)*pObj >> 0x24].Level;
          iVar8 = iVar3;
        }
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < pDVar10->nSubgr0[bVar1]);
    if (local_5c != -1) {
      return local_5c;
    }
  }
  __assert_fail("p_OutBest != -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darLib.c"
                ,0x4d9,"int Dar2_LibEval(Gia_Man_t *, Vec_Int_t *, unsigned int, int, Vec_Int_t *)")
  ;
}

Assistant:

int Dar2_LibEval( Gia_Man_t * p, Vec_Int_t * vCutLits, unsigned uTruth, int fKeepLevel, Vec_Int_t * vLeavesBest2 )
{
    int p_OutBest    = -1;
    int p_OutNumBest = -1;
    int p_LevelBest  =  1000000;
    int p_GainBest   = -1000000;
    int p_ClassBest  = -1;
//    int fTraining    =  0;
    Dar_LibObj_t * pObj;
    int Out, k, Class, nNodesSaved, nNodesAdded, nNodesGained;
//    abctime clk = Abc_Clock();
    assert( Vec_IntSize(vCutLits) == 4 );
    assert( (uTruth >> 16) == 0 );
    // check if the cut exits and assigns leaves and their levels
    if ( !Dar2_LibCutMatch(p, vCutLits, uTruth) )
        return -1;
    // mark MFFC of the node
//    nNodesSaved = Dar2_LibCutMarkMffc( p->pAig, pRoot, pCut->nLeaves, p->pPars->fPower? &PowerSaved : NULL );
    nNodesSaved = 0;
    // evaluate the cut
    Class = s_DarLib->pMap[uTruth];
    Dar2_LibEvalAssignNums( p, Class );
    // profile outputs by their savings
//    p->nTotalSubgs += s_DarLib->nSubgr0[Class];
//    p->ClassSubgs[Class] += s_DarLib->nSubgr0[Class];
    for ( Out = 0; Out < s_DarLib->nSubgr0[Class]; Out++ )
    {
        pObj = Dar_LibObj(s_DarLib, s_DarLib->pSubgr0[Class][Out]);
//        nNodesAdded = Dar2_LibEval_rec( pObj, Out, nNodesSaved - !p->pPars->fUseZeros, Required, p->pPars->fPower? &PowerAdded : NULL );
        nNodesAdded = Dar2_LibEval_rec( pObj, Out );
        nNodesGained = nNodesSaved - nNodesAdded;
        if ( fKeepLevel )
        {
            if ( s_DarLib->pDatas[pObj->Num].Level >  p_LevelBest || 
                (s_DarLib->pDatas[pObj->Num].Level == p_LevelBest && nNodesGained <= p_GainBest) )
                continue;
        }
        else
        {
            if ( nNodesGained <  p_GainBest || 
                (nNodesGained == p_GainBest && s_DarLib->pDatas[pObj->Num].Level >= p_LevelBest) )
                continue;
        }
        // remember this possibility
        Vec_IntClear( vLeavesBest2 );
        for ( k = 0; k < Vec_IntSize(vCutLits); k++ )
            Vec_IntPush( vLeavesBest2, s_DarLib->pDatas[k].iGunc );
        p_OutBest    = s_DarLib->pSubgr0[Class][Out];
        p_OutNumBest = Out;
        p_LevelBest  = s_DarLib->pDatas[pObj->Num].Level;
        p_GainBest   = nNodesGained;
        p_ClassBest  = Class;
//        assert( p_LevelBest <= Required );
    }
//clk = Abc_Clock() - clk;
//p->ClassTimes[Class] += clk;
//p->timeEval += clk;
    assert( p_OutBest != -1 );
    return p_OutBest;
}